

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateJsonNameConflictProto2Legacy_Test
::TestBody(ValidationErrorTest_ValidateJsonNameConflictProto2Legacy_Test *this)

{
  string_view local_20;
  ValidationErrorTest_ValidateJsonNameConflictProto2Legacy_Test *local_10;
  ValidationErrorTest_ValidateJsonNameConflictProto2Legacy_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "name: \'foo.proto\' syntax: \'proto2\' message_type {  name: \'Foo\'  options { deprecated_legacy_json_field_conflicts: true }  field { name:\'AB\' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 }  field { name:\'_a__b_\' number:2 label:LABEL_OPTIONAL type:TYPE_INT32 }}"
            );
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,local_20);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateJsonNameConflictProto2Legacy) {
  BuildFile(
      "name: 'foo.proto' "
      "syntax: 'proto2' "
      "message_type {"
      "  name: 'Foo'"
      "  options { deprecated_legacy_json_field_conflicts: true }"
      "  field { name:'AB' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 }"
      "  field { name:'_a__b_' number:2 label:LABEL_OPTIONAL type:TYPE_INT32 }"
      "}");
}